

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4d3168::SpotController::on_create
          (SpotController *this,Caliper *param_1,Channel *param_2)

{
  bool bVar1;
  ostream *poVar2;
  ConfigManager *this_00;
  string sStack_238;
  Log local_218;
  
  this_00 = &this->m_timeseries_mgr;
  bVar1 = cali::ConfigManager::error(this_00);
  if (bVar1) {
    std::ofstream::ofstream(&local_218);
    local_218.m_level = 0;
    poVar2 = cali::Log::stream(&local_218);
    poVar2 = std::operator<<(poVar2,"[spot controller]: Timeseries config error: ");
    cali::ConfigManager::error_msg_abi_cxx11_(&sStack_238,this_00);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_238);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&sStack_238);
    std::ofstream::~ofstream(&local_218);
  }
  cali::ConfigManager::start(this_00);
  return;
}

Assistant:

void on_create(Caliper*, Channel&) override
    {
        if (m_timeseries_mgr.error())
            Log(0).stream() << "[spot controller]: Timeseries config error: " << m_timeseries_mgr.error_msg()
                            << std::endl;

        m_timeseries_mgr.start();
    }